

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_maps.cpp
# Opt level: O0

double anon_unknown.dwarf_4722b::get_min(vector<double,_std::allocator<double>_> *ary)

{
  bool bVar1;
  reference pdVar2;
  undefined8 in_RDI;
  double v;
  const_iterator __end1;
  const_iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  double min;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc8;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffffd0;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_20;
  undefined8 local_18;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *local_10;
  undefined8 local_8;
  
  local_8 = in_RDI;
  local_10 = (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
             std::numeric_limits<double>::max();
  local_18 = local_8;
  local_20._M_current =
       (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffffc8);
  std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    pdVar2 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_20);
    in_stack_ffffffffffffffd0 =
         (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)*pdVar2
    ;
    if ((double)in_stack_ffffffffffffffd0 < (double)local_10) {
      local_10 = in_stack_ffffffffffffffd0;
    }
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_20);
  }
  return (double)local_10;
}

Assistant:

inline double get_min(const std::vector<double>& ary) {
    double min = std::numeric_limits<double>::max();
    for (auto v : ary) {
        if (v < min) {
            min = v;
        }
    }
    return min;
}